

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-input.c
# Opt level: O3

void msg_flush_split_existing(wchar_t w,int *x)

{
  wchar_t wVar1;
  wchar_t wVar2;
  wchar_t *c_00;
  int *p;
  wchar_t x_00;
  int *a_00;
  long lVar3;
  wchar_t c;
  wchar_t a;
  wchar_t local_4c;
  wchar_t *local_48;
  ulong local_40;
  int local_34;
  
  wVar2 = w + L'\xfffffff8';
  if (message_column < w + L'\xfffffff8') {
    wVar2 = message_column;
  }
  wVar1 = wVar2;
  do {
    x_00 = wVar2;
    if (wVar1 <= w / 2) break;
    x_00 = wVar1 + L'\xffffffff';
    Term_what(x_00,L'\0',&local_34,&local_4c);
    wVar1 = x_00;
  } while (local_4c != L' ');
  wVar2 = message_column - x_00;
  if (wVar2 == L'\0' || message_column < x_00) {
    c_00 = (wchar_t *)0x0;
    p = (int *)0x0;
    message_column = wVar2;
  }
  else {
    message_column = wVar2;
    c_00 = (wchar_t *)mem_alloc((ulong)(uint)wVar2 << 2);
    p = (int *)mem_alloc((long)message_column << 2);
    if (L'\0' < message_column) {
      lVar3 = 0;
      a_00 = p;
      local_48 = c_00;
      local_40 = (ulong)(uint)w;
      do {
        Term_what(x_00 + (int)lVar3,L'\0',a_00,c_00);
        lVar3 = lVar3 + 1;
        c_00 = c_00 + 1;
        a_00 = a_00 + 1;
      } while (lVar3 < message_column);
      w = (wchar_t)local_40;
      c_00 = local_48;
    }
  }
  Term_erase(x_00,L'\0',w);
  msg_flush(x_00 + L'\x01');
  if (L'\0' < message_column) {
    lVar3 = 0;
    do {
      Term_putch((wchar_t)lVar3,L'\0',p[lVar3],c_00[lVar3]);
      lVar3 = lVar3 + 1;
    } while (lVar3 < message_column);
    mem_free(p);
    mem_free(c_00);
  }
  return;
}

Assistant:

static void msg_flush_split_existing(int w, int *x)
{
	/* Default place to split what's there */
	int split = MIN(*x, w - 8);
	int i = split;
	wchar_t *svc = NULL;
	int *sva = NULL;

	/* Find the rightmost split point. */
	while (i > w / 2) {
		int a;
		wchar_t c;

		--i;
		Term_what(i, 0, &a, &c);
		if (c == L' ') {
			split = i;
			break;
		}
	}

	/* Remember what's on and after the split point. */
	*x -= split;
	if (*x > 0) {
		svc = mem_alloc(*x * sizeof(*svc));
		sva = mem_alloc(*x * sizeof(*sva));
		for (i = 0; i < *x; ++i) {
			Term_what(i + split, 0, &sva[i], &svc[i]);
		}
	}

	Term_erase(split, 0, w);
	msg_flush(split + 1);

	/* Put back what was remembered. */
	if (*x > 0) {
		for (i = 0; i < *x; ++i) {
			Term_putch(i, 0, sva[i], svc[i]);
		}
		mem_free(sva);
		mem_free(svc);
	}
}